

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktUniformBlockCase.cpp
# Opt level: O2

int vkt::ubo::anon_unknown_0::computeStd140BaseAlignment(VarType *type)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  DataType DVar4;
  StructType *pSVar5;
  uint uVar6;
  pointer pSVar7;
  
  if (type->m_type == TYPE_ARRAY) {
    uVar2 = computeStd140BaseAlignment((type->m_data).array.elementType);
    uVar6 = ((int)uVar2 / 0x10) * 0x10;
    uVar3 = uVar6 + 0x10;
    if (uVar6 == uVar2) {
      uVar3 = uVar2;
    }
  }
  else if (type->m_type == TYPE_BASIC) {
    DVar4 = (type->m_data).basicType;
    if (DVar4 - TYPE_FLOAT_MAT2 < 9 || DVar4 - TYPE_DOUBLE_MAT2 < 9) {
      if ((type->m_flags & 0x40) == 0) {
        iVar1 = glu::getDataTypeMatrixNumRows(DVar4);
      }
      else {
        iVar1 = glu::getDataTypeMatrixNumColumns(DVar4);
      }
      DVar4 = glu::getDataTypeFloatVec(iVar1);
      iVar1 = getDataTypeArrayStride(DVar4);
      return iVar1;
    }
    uVar3 = 0;
    if (DVar4 - TYPE_FLOAT < 0x26) {
      uVar3 = *(uint *)(&DAT_009a37f4 + (ulong)(DVar4 - TYPE_FLOAT) * 4);
    }
  }
  else {
    pSVar5 = (type->m_data).structPtr;
    uVar2 = 0;
    for (pSVar7 = (pSVar5->m_members).
                  super__Vector_base<vkt::ubo::StructMember,_std::allocator<vkt::ubo::StructMember>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pSVar7 != (pSVar5->m_members).
                  super__Vector_base<vkt::ubo::StructMember,_std::allocator<vkt::ubo::StructMember>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pSVar7 = pSVar7 + 1) {
      uVar3 = computeStd140BaseAlignment(&pSVar7->m_type);
      if ((int)uVar2 <= (int)uVar3) {
        uVar2 = uVar3;
      }
      pSVar5 = (type->m_data).structPtr;
    }
    uVar3 = (uVar2 & 0xfffffff0) + 0x10;
    if ((uVar2 & 0xfffffff0) == uVar2) {
      uVar3 = uVar2;
    }
  }
  return uVar3;
}

Assistant:

int computeStd140BaseAlignment (const VarType& type)
{
	const int vec4Alignment = (int)sizeof(deUint32)*4;

	if (type.isBasicType())
	{
		glu::DataType basicType = type.getBasicType();

		if (glu::isDataTypeMatrix(basicType))
		{
			bool	isRowMajor	= !!(type.getFlags() & LAYOUT_ROW_MAJOR);
			int		vecSize		= isRowMajor ? glu::getDataTypeMatrixNumColumns(basicType)
											 : glu::getDataTypeMatrixNumRows(basicType);

			return getDataTypeArrayStride(glu::getDataTypeFloatVec(vecSize));
		}
		else
			return getDataTypeByteAlignment(basicType);
	}
	else if (type.isArrayType())
	{
		int elemAlignment = computeStd140BaseAlignment(type.getElementType());

		// Round up to alignment of vec4
		return deRoundUp32(elemAlignment, vec4Alignment);
	}
	else
	{
		DE_ASSERT(type.isStructType());

		int maxBaseAlignment = 0;

		for (StructType::ConstIterator memberIter = type.getStruct().begin(); memberIter != type.getStruct().end(); memberIter++)
			maxBaseAlignment = de::max(maxBaseAlignment, computeStd140BaseAlignment(memberIter->getType()));

		return deRoundUp32(maxBaseAlignment, vec4Alignment);
	}
}